

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O2

Vec3 * __thiscall hacd::vector<HACD::Vec3>::push_back(vector<HACD::Vec3> *this,Vec3 *a)

{
  Vec3 *pVVar1;
  HaF32 HVar2;
  HaU32 capacity;
  uint uVar3;
  uint uVar4;
  HaU32 capacity_00;
  
  uVar3 = this->mCapacity & 0x7fffffff;
  uVar4 = this->mSize;
  if (uVar3 <= uVar4) {
    capacity_00 = 1;
    if (uVar3 != 0) {
      capacity_00 = uVar3 * 2;
    }
    grow(this,capacity_00);
    uVar4 = this->mSize;
  }
  pVVar1 = this->mData;
  pVVar1[uVar4].z = a->z;
  HVar2 = a->y;
  pVVar1 = pVVar1 + uVar4;
  pVVar1->x = a->x;
  pVVar1->y = HVar2;
  uVar4 = this->mSize;
  this->mSize = uVar4 + 1;
  return this->mData + uVar4;
}

Assistant:

HACD_FORCE_INLINE T& push_back(const T& a)
		{
			if(capacity()<=mSize) 
				grow(capacityIncrement());

			HACD_PLACEMENT_NEW((void*)(mData + mSize),T)(a);

			return mData[mSize++];
		}